

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O1

char * INT_create_multityped_action_spec(FMStructDescList *input_format_lists,char *function)

{
  char *pcVar1;
  FMStructDescList p_Var2;
  size_t sVar3;
  size_t sVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  FMStructDescList f;
  
  for (uVar7 = 0;
      (input_format_lists != (FMStructDescList *)0x0 &&
      (input_format_lists[uVar7] != (FMStructDescList)0x0)); uVar7 = uVar7 + 1) {
  }
  pcVar1 = (char *)INT_CMmalloc(0x32);
  sprintf(pcVar1,"Multityped Action   List Count %d\n",uVar7 & 0xffffffff);
  if ((int)uVar7 != 0) {
    uVar8 = 0;
    do {
      f = input_format_lists[uVar8];
      uVar5 = 0;
      if (f != (FMStructDescList)0x0) {
        uVar5 = 0;
        p_Var2 = f;
        do {
          if (p_Var2->format_name == (char *)0x0) break;
          uVar5 = uVar5 + 1;
          p_Var2 = p_Var2 + 1;
        } while (f != (FMStructDescList)0x0);
      }
      sVar3 = strlen(pcVar1);
      pcVar1 = (char *)INT_CMrealloc(pcVar1,sVar3 + 0x32);
      sVar3 = strlen(pcVar1);
      sprintf(pcVar1 + sVar3,"Next format   Subformat Count %d\n",(ulong)uVar5);
      if (uVar5 != 0) {
        uVar6 = (ulong)uVar5;
        do {
          pcVar1 = add_FMfieldlist_to_string(pcVar1,f);
          f = f + 1;
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != (uVar7 & 0xffffffff));
  }
  sVar3 = strlen(pcVar1);
  sVar4 = strlen(function);
  pcVar1 = (char *)INT_CMrealloc(pcVar1,sVar3 + sVar4 + 1);
  sVar3 = strlen(pcVar1);
  strcpy(pcVar1 + sVar3,function);
  return pcVar1;
}

Assistant:

extern char *
INT_create_multityped_action_spec(FMStructDescList *input_format_lists, char *function)
{
    int list_count = 0;
    int l, i;
    char *str;
    while(input_format_lists && input_format_lists[list_count] != NULL)
	list_count++;

    str = malloc(50);
    sprintf(str, "Multityped Action   List Count %d\n", list_count);

    for (l = 0; l < list_count; l++) {
	int format_count = 0;
	FMStructDescList format_list = input_format_lists[l];
	while(format_list && format_list[format_count].format_name != NULL)
	    format_count++;
	str = realloc(str, strlen(str) + 50);
	sprintf(str + strlen(str), "Next format   Subformat Count %d\n",
		format_count);
	for (i = 0 ; i < format_count; i++) {
	    str = add_FMfieldlist_to_string(str, &format_list[i]);
	}
    }

    str = realloc(str, strlen(str) + strlen(function) + 1);
    strcpy(&str[strlen(str)], function);
    return str;
}